

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

bool re2::RE2::Arg::parse_ulong_radix(char *str,size_t n,void *dest,int radix)

{
  char *__nptr;
  int *piVar1;
  ulong uVar2;
  size_t n_local;
  char *end;
  char buf [33];
  
  if (n != 0) {
    n_local = n;
    __nptr = TerminateNumber(buf,0x21,str,&n_local,false);
    if (*__nptr == '-') {
      return false;
    }
    piVar1 = __errno_location();
    *piVar1 = 0;
    uVar2 = strtoul(__nptr,&end,radix);
    if ((end == __nptr + n_local) && (*piVar1 == 0)) {
      if (dest == (void *)0x0) {
        return true;
      }
      *(ulong *)dest = uVar2;
      return true;
    }
  }
  return false;
}

Assistant:

bool RE2::Arg::parse_ulong_radix(const char* str,
                                 size_t n,
                                 void* dest,
                                 int radix) {
  if (n == 0) return false;
  char buf[kMaxNumberLength+1];
  str = TerminateNumber(buf, sizeof buf, str, &n, false);
  if (str[0] == '-') {
    // strtoul() will silently accept negative numbers and parse
    // them.  This module is more strict and treats them as errors.
    return false;
  }

  char* end;
  errno = 0;
  unsigned long r = strtoul(str, &end, radix);
  if (end != str + n) return false;   // Leftover junk
  if (errno) return false;
  if (dest == NULL) return true;
  *(reinterpret_cast<unsigned long*>(dest)) = r;
  return true;
}